

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_meth_message_type(parser *p)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  char *name;
  parser_error pVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    _Var1 = parser_hasval(p,"msg");
    pVar4 = PARSE_ERROR_NONE;
    if (_Var1) {
      name = parser_getstr(p,"msg");
      iVar2 = message_lookup_by_name(name);
      if (iVar2 < 0) {
        pVar4 = PARSE_ERROR_INVALID_MESSAGE;
      }
      else {
        *(int *)((long)pvVar3 + 0xc) = iVar2;
        pVar4 = PARSE_ERROR_NONE;
      }
    }
    return pVar4;
  }
  __assert_fail("meth",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0xa0,"enum parser_error parse_meth_message_type(struct parser *)");
}

Assistant:

static enum parser_error parse_meth_message_type(struct parser *p)
{
	int msg_index;
	const char *type;
	struct blow_method *meth = parser_priv(p);
	assert(meth);

	if (parser_hasval(p, "msg")) {
		type = parser_getstr(p, "msg");

		msg_index = message_lookup_by_name(type);

		if (msg_index < 0)
			return PARSE_ERROR_INVALID_MESSAGE;

		meth->msgt = msg_index;
	}
	return PARSE_ERROR_NONE;
}